

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O2

void nn_cinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  
  if (type == -3 && src == -2) {
    nn_ins_disconnect((nn_ins_item *)&self[1].shutdown_fn);
    nn_sinproc_stop((nn_sinproc *)&self[1].stopped);
    *(undefined4 *)&self[1].fn = 4;
  }
  else if (*(uint *)&self[1].fn != 4) {
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
            ,0x92);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_sinproc_isidle((nn_sinproc *)&self[1].stopped);
  if (iVar1 != 0) {
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped_noevent(self);
    nn_epbase_stopped((nn_epbase *)&self[1].shutdown_fn);
    return;
  }
  return;
}

Assistant:

static void nn_cinproc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cinproc *cinproc;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {

        /*  First, unregister the endpoint from the global repository of inproc
            endpoints. This way, new connections cannot be created anymore. */
        nn_ins_disconnect (&cinproc->item);

        /*  Stop the existing connection. */
        nn_sinproc_stop (&cinproc->sinproc);
        cinproc->state = NN_CINPROC_STATE_STOPPING;
    }
    if (nn_slow (cinproc->state == NN_CINPROC_STATE_STOPPING)) {
        if (!nn_sinproc_isidle (&cinproc->sinproc))
            return;
        cinproc->state = NN_CINPROC_STATE_IDLE;
        nn_fsm_stopped_noevent (&cinproc->fsm);
        nn_epbase_stopped (&cinproc->item.epbase);
        return;
    }

    nn_fsm_bad_state(cinproc->state, src, type);
}